

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::Vector::Encode(Vector *this,KDataStream *stream)

{
  KDataStream::Write<float>(stream,(float)this->m_f32X);
  KDataStream::Write<float>(stream,(float)this->m_f32Y);
  KDataStream::Write<float>(stream,(float)this->m_f32Z);
  return;
}

Assistant:

void Vector::Encode( KDataStream & stream ) const
{
    stream << m_f32X
           << m_f32Y
           << m_f32Z;
}